

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

int xmlTextWriterEndComment(xmlTextWriterPtr writer)

{
  int iVar1;
  xmlLinkPtr lk_00;
  void *pvVar2;
  xmlTextWriterStackEntry *p;
  xmlLinkPtr lk;
  int sum;
  int count;
  xmlTextWriterPtr writer_local;
  
  if (writer == (xmlTextWriterPtr)0x0) {
    xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_INTERNAL_ERROR,
                    "xmlTextWriterEndComment : invalid writer!\n");
    writer_local._4_4_ = -1;
  }
  else {
    lk_00 = xmlListFront(writer->nodes);
    if (lk_00 == (xmlLinkPtr)0x0) {
      xmlWriterErrMsg(writer,XML_ERR_INTERNAL_ERROR,
                      "xmlTextWriterEndComment : not allowed in this context!\n");
      writer_local._4_4_ = -1;
    }
    else {
      pvVar2 = xmlLinkGetData(lk_00);
      if (pvVar2 == (void *)0x0) {
        writer_local._4_4_ = -1;
      }
      else if (*(int *)((long)pvVar2 + 8) == 0x10) {
        lk._0_4_ = xmlOutputBufferWriteString(writer->out,"-->");
        if ((int)lk < 0) {
          writer_local._4_4_ = -1;
        }
        else {
          if (writer->indent != 0) {
            iVar1 = xmlOutputBufferWriteString(writer->out,"\n");
            if (iVar1 < 0) {
              return -1;
            }
            lk._0_4_ = iVar1 + (int)lk;
          }
          xmlListPopFront(writer->nodes);
          writer_local._4_4_ = (int)lk;
        }
      }
      else {
        writer_local._4_4_ = -1;
      }
    }
  }
  return writer_local._4_4_;
}

Assistant:

int
xmlTextWriterEndComment(xmlTextWriterPtr writer)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if (writer == NULL) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterEndComment : invalid writer!\n");
        return -1;
    }

    lk = xmlListFront(writer->nodes);
    if (lk == 0) {
        xmlWriterErrMsg(writer, XML_ERR_INTERNAL_ERROR,
                        "xmlTextWriterEndComment : not allowed in this context!\n");
        return -1;
    }

    p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
    if (p == 0)
        return -1;

    sum = 0;
    switch (p->state) {
        case XML_TEXTWRITER_COMMENT:
            count = xmlOutputBufferWriteString(writer->out, "-->");
            if (count < 0)
                return -1;
            sum += count;
            break;
        default:
            return -1;
    }

    if (writer->indent) {
        count = xmlOutputBufferWriteString(writer->out, "\n");
        if (count < 0)
            return -1;
        sum += count;
    }

    xmlListPopFront(writer->nodes);
    return sum;
}